

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O0

void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n)

{
  long lVar1;
  uint8_t *b;
  uint64_t *puVar2;
  uint64_t *n;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong __n;
  undefined8 uStack_90;
  uint8_t auStack_88 [4];
  uint32_t local_84;
  uint8_t *local_80;
  ulong local_78;
  ulong local_70;
  uint8_t local_61;
  uint8_t *puStack_60;
  uint8_t x;
  uint8_t *os;
  uint32_t i;
  uint32_t len;
  uint8_t *p;
  unsigned_long __vla_expr0;
  uint local_34;
  uint64_t *puStack_30;
  uint32_t sw;
  uint64_t *r2_n;
  uint64_t *p_n;
  uint64_t *puStack_18;
  uint32_t nLen;
  uint64_t *p_r2_n_local;
  Spec_FFDHE_ffdhe_alg a_local;
  
  uStack_90 = 0x24bc8e;
  puStack_18 = p_r2_n;
  p_r2_n_local._7_1_ = a;
  uVar4 = ffdhe_len(a);
  p_n._4_4_ = (uVar4 - 1 >> 3) + 1;
  r2_n = puStack_18;
  puStack_30 = puStack_18 + p_n._4_4_;
  local_70 = (ulong)p_r2_n_local._7_1_;
  switch(local_70) {
  case 0:
    local_34 = 0x100;
    break;
  case 1:
    local_34 = 0x180;
    break;
  case 2:
    local_34 = 0x200;
    break;
  case 3:
    local_34 = 0x300;
    break;
  case 4:
    local_34 = 0x400;
    break;
  default:
    uStack_90 = 0x24bd22;
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_FFDHE.c"
            ,99);
    uStack_90 = 0x24bd2c;
    exit(0xfd);
  }
  p = (uint8_t *)(ulong)local_34;
  lVar1 = -(long)p;
  __n = (ulong)local_34;
  local_80 = auStack_88 + lVar1;
  __vla_expr0 = (unsigned_long)auStack_88;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24bd8f;
  memset(auStack_88 + lVar1,0,__n);
  bVar3 = p_r2_n_local._7_1_;
  local_78 = (ulong)p_r2_n_local._7_1_;
  switch(local_78) {
  case 0:
    _i = Hacl_Impl_FFDHE_Constants_ffdhe_p2048;
    break;
  case 1:
    _i = Hacl_Impl_FFDHE_Constants_ffdhe_p3072;
    break;
  case 2:
    _i = Hacl_Impl_FFDHE_Constants_ffdhe_p4096;
    break;
  case 3:
    _i = Hacl_Impl_FFDHE_Constants_ffdhe_p6144;
    break;
  case 4:
    _i = Hacl_Impl_FFDHE_Constants_ffdhe_p8192;
    break;
  default:
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be16;
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_FFDHE.c"
            ,0x88);
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be20;
    exit(0xfd);
  }
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be29;
  os._4_4_ = ffdhe_len(bVar3);
  bVar3 = p_r2_n_local._7_1_;
  for (os._0_4_ = 0; (uint)os < os._4_4_; os._0_4_ = (uint)os + 1) {
    puStack_60 = local_80;
    local_61 = _i[(uint)os];
    local_80[(uint)os] = local_61;
  }
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be71;
  uVar4 = ffdhe_len(bVar3);
  puVar2 = r2_n;
  b = local_80;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be80;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar4,b,puVar2);
  bVar3 = p_r2_n_local._7_1_;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be89;
  uVar4 = ffdhe_len(bVar3);
  bVar3 = p_r2_n_local._7_1_;
  local_84 = (uVar4 - 1 >> 3) + 1;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24be9e;
  uVar5 = ffdhe_len(bVar3);
  n = r2_n;
  puVar2 = puStack_30;
  uVar4 = local_84;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x24beb6;
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(uVar4,uVar5 * 8 - 1,n,puVar2);
  return;
}

Assistant:

static inline void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a, uint64_t *p_r2_n)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  uint32_t sw;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        sw = 256U;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        sw = 384U;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        sw = 512U;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        sw = 768U;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        sw = 1024U;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), sw);
  uint8_t p_s[sw];
  memset(p_s, 0U, sw * sizeof (uint8_t));
  const uint8_t *p;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p2048;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p3072;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p4096;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p6144;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p8192;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  uint32_t len = ffdhe_len(a);
  for (uint32_t i = 0U; i < len; i++)
  {
    uint8_t *os = p_s;
    uint8_t x = p[i];
    os[i] = x;
  }
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(ffdhe_len(a), p_s, p_n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    8U * ffdhe_len(a) - 1U,
    p_n,
    r2_n);
}